

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_fader_set_fade(ma_fader *pFader,float volumeBeg,float volumeEnd,ma_uint64 lengthInFrames)

{
  ma_uint64 local_20;
  ma_uint64 lengthInFrames_local;
  float volumeEnd_local;
  float volumeBeg_local;
  ma_fader *pFader_local;
  
  if (pFader != (ma_fader *)0x0) {
    lengthInFrames_local._4_4_ = volumeBeg;
    if (volumeBeg < 0.0) {
      lengthInFrames_local._4_4_ = ma_fader_get_current_volume(pFader);
    }
    local_20 = lengthInFrames;
    if (0xffffffff < lengthInFrames) {
      local_20 = 0xffffffff;
    }
    pFader->volumeBeg = lengthInFrames_local._4_4_;
    pFader->volumeEnd = volumeEnd;
    pFader->lengthInFrames = local_20;
    pFader->cursorInFrames = 0;
  }
  return;
}

Assistant:

MA_API void ma_fader_set_fade(ma_fader* pFader, float volumeBeg, float volumeEnd, ma_uint64 lengthInFrames)
{
    if (pFader == NULL) {
        return;
    }

    /* If the volume is negative, use current volume. */
    if (volumeBeg < 0) {
        volumeBeg = ma_fader_get_current_volume(pFader);
    }

    /*
    The length needs to be clamped to 32-bits due to how we convert it to a float for linear
    interpolation reasons. I might change this requirement later, but for now it's not important.
    */
    if (lengthInFrames > UINT_MAX) {
        lengthInFrames = UINT_MAX;
    }

    pFader->volumeBeg      = volumeBeg;
    pFader->volumeEnd      = volumeEnd;
    pFader->lengthInFrames = lengthInFrames;
    pFader->cursorInFrames = 0; /* Reset cursor. */
}